

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecode.c
# Opt level: O0

int bc_append(lgx_compiler_t *c,uint i)

{
  uint32_t *puVar1;
  uint *buf;
  uint i_local;
  lgx_compiler_t *c_local;
  
  if ((c->bc).size <= (c->bc).length) {
    (c->bc).size = (c->bc).size << 1;
    puVar1 = (uint32_t *)realloc((c->bc).buffer,(ulong)(c->bc).size << 2);
    if (puVar1 == (uint32_t *)0x0) {
      return 1;
    }
    (c->bc).buffer = puVar1;
  }
  (c->bc).buffer[(c->bc).length] = i;
  (c->bc).length = (c->bc).length + 1;
  return 0;
}

Assistant:

static int bc_append(lgx_compiler_t* c, unsigned i) {
    if (c->bc.length >= c->bc.size) {
        c->bc.size *= 2;
        unsigned* buf = (unsigned *)xrealloc(c->bc.buffer, c->bc.size * sizeof(unsigned));
        if (!buf) {
            return 1;
        }
        c->bc.buffer = buf;
    }

    c->bc.buffer[c->bc.length] = i;
    c->bc.length ++;

    return 0;
}